

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O2

int input_nnybble(uchar *infile,int n,uchar *array)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  
  lVar2 = nextchar;
  if (n == 1) {
    iVar3 = input_nybble(infile);
    *array = (uchar)iVar3;
    return iVar3;
  }
  if (bits_to_go == 8) {
    nextchar = nextchar + -1;
    bits_to_go = 0;
  }
  else if (bits_to_go != 0) {
    bVar1 = (byte)bits_to_go;
    lVar6 = 0;
    iVar3 = n / 2;
    if (n / 2 < 1) {
      iVar3 = 0;
    }
    lVar5 = nextchar + 1;
    uVar4 = buffer2;
    for (; iVar3 != (int)lVar6; lVar6 = lVar6 + 1) {
      uVar4 = uVar4 << 8 | (uint)infile[lVar6 + lVar2];
      nextchar = lVar5 + lVar6;
      buffer2 = uVar4;
      array[lVar6 * 2] = (byte)((int)uVar4 >> (bVar1 + 4 & 0x1f)) & 0xf;
      array[lVar6 * 2 + 1] = (byte)((int)uVar4 >> (bVar1 & 0x1f)) & 0xf;
    }
    goto LAB_001733a2;
  }
  lVar2 = nextchar;
  lVar6 = 0;
  iVar3 = n / 2;
  if (n / 2 < 1) {
    iVar3 = 0;
  }
  lVar5 = nextchar + 1;
  uVar4 = buffer2;
  for (; iVar3 != (int)lVar6; lVar6 = lVar6 + 1) {
    bVar1 = infile[lVar6 + lVar2];
    uVar4 = uVar4 << 8 | (uint)bVar1;
    nextchar = lVar5 + lVar6;
    buffer2 = uVar4;
    array[lVar6 * 2] = bVar1 >> 4;
    array[lVar6 * 2 + 1] = bVar1 & 0xf;
  }
LAB_001733a2:
  iVar3 = iVar3 * 2;
  if (iVar3 != n) {
    iVar3 = input_nybble(infile);
    array[(long)n + -1] = (uchar)iVar3;
  }
  return iVar3;
}

Assistant:

static int input_nnybble(unsigned char *infile, int n, unsigned char array[])
{
	/* copy n 4-bit nybbles from infile to the lower 4 bits of array */

int ii, kk, shift1, shift2;

/*  forcing byte alignment doesn;t help, and even makes it go slightly slower
if (bits_to_go != 8) input_nbits(infile, bits_to_go);
*/
	if (n == 1) {
		array[0] = input_nybble(infile);
		return(0);
	}
	
	if (bits_to_go == 8) {
		/*
		   already have 2 full nybbles in buffer2, so 
		   backspace the infile array to reuse last char
		*/
		nextchar--;
		bits_to_go = 0;
	}
	
	/* bits_to_go now has a value in the range 0 - 7.  After adding  */
	/* another byte, bits_to_go effectively will be in range 8 - 15 */	

	shift1 = bits_to_go + 4;   /* shift1 will be in range 4 - 11 */
	shift2 = bits_to_go;	   /* shift2 will be in range 0 -  7 */
	kk = 0;

	/* special case */
	if (bits_to_go == 0) 
	{
	    for (ii = 0; ii < n/2; ii++) {
		/*
		 * refill the buffer with next byte
		 */
		buffer2 = (buffer2<<8) | (int) infile[nextchar];
		nextchar++;
		array[kk]     = (int) ((buffer2>>4) & 15);
		array[kk + 1] = (int) ((buffer2) & 15);    /* no shift required */
		kk += 2;
	    }
	}
	else
	{
	    for (ii = 0; ii < n/2; ii++) {
		/*
		 * refill the buffer with next byte
		 */
		buffer2 = (buffer2<<8) | (int) infile[nextchar];
		nextchar++;
		array[kk]     = (int) ((buffer2>>shift1) & 15);
		array[kk + 1] = (int) ((buffer2>>shift2) & 15);
		kk += 2;
	    }
	}


	if (ii * 2 != n) {  /* have to read last odd byte */
		array[n-1] = input_nybble(infile);
	}

	return( (buffer2>>bits_to_go) & 15 ); 
}